

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeAddExceptions(unicode_tokenizer *p,int bAlnum,char *zIn,int nIn)

{
  int iVar1;
  byte *pbVar2;
  void *pvVar3;
  int in_ECX;
  byte *pbVar4;
  byte *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar5;
  int j;
  int i;
  int nNew;
  int *aNew;
  int nEntry;
  uint iCode;
  uchar *zTerm;
  uchar *z;
  undefined1 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  int local_4c;
  int local_40;
  uint local_3c;
  byte *local_30;
  
  pbVar2 = in_RDX + in_ECX;
  local_40 = 0;
  local_30 = in_RDX;
  while (local_30 < pbVar2) {
    pbVar4 = local_30 + 1;
    local_3c = (uint)*local_30;
    local_30 = pbVar4;
    if (0xbf < local_3c) {
      local_3c = (uint)""[local_3c - 0xc0];
      while( true ) {
        bVar5 = false;
        if (local_30 < pbVar2) {
          bVar5 = (*local_30 & 0xc0) == 0x80;
        }
        if (!bVar5) break;
        local_3c = local_3c * 0x40 + (*local_30 & 0x3f);
        local_30 = local_30 + 1;
      }
      if (((local_3c < 0x80) || ((local_3c & 0xfffff800) == 0xd800)) ||
         ((local_3c & 0xfffffffe) == 0xfffe)) {
        local_3c = 0xfffd;
      }
      in_stack_ffffffffffffffab = 0;
    }
    iVar1 = sqlite3FtsUnicodeIsalnum(local_3c);
    if ((iVar1 != in_ESI) && (iVar1 = sqlite3FtsUnicodeIsdiacritic(local_3c), iVar1 == 0)) {
      local_40 = local_40 + 1;
    }
  }
  if (local_40 != 0) {
    pvVar3 = sqlite3_realloc64((void *)CONCAT44(in_stack_ffffffffffffffac,
                                                CONCAT13(in_stack_ffffffffffffffab,
                                                         CONCAT12(in_stack_ffffffffffffffaa,
                                                                  CONCAT11(in_stack_ffffffffffffffa9
                                                                           ,
                                                  in_stack_ffffffffffffffa8)))),0x23de71);
    if (pvVar3 == (void *)0x0) {
      return 7;
    }
    local_4c = *(int *)(in_RDI + 0xc);
    local_30 = in_RDX;
    while (local_30 < pbVar2) {
      pbVar4 = local_30 + 1;
      local_3c = (uint)*local_30;
      local_30 = pbVar4;
      if (0xbf < local_3c) {
        local_3c = (uint)""[local_3c - 0xc0];
        while( true ) {
          bVar5 = false;
          if (local_30 < pbVar2) {
            bVar5 = (*local_30 & 0xc0) == 0x80;
          }
          if (!bVar5) break;
          local_3c = local_3c * 0x40 + (*local_30 & 0x3f);
          local_30 = local_30 + 1;
        }
        if (((local_3c < 0x80) || ((local_3c & 0xfffff800) == 0xd800)) ||
           ((local_3c & 0xfffffffe) == 0xfffe)) {
          local_3c = 0xfffd;
        }
      }
      iVar1 = sqlite3FtsUnicodeIsalnum(local_3c);
      if ((iVar1 != in_ESI) && (iVar1 = sqlite3FtsUnicodeIsdiacritic(local_3c), iVar1 == 0)) {
        local_50 = 0;
        while( true ) {
          bVar5 = false;
          if (local_50 < local_4c) {
            bVar5 = *(int *)((long)pvVar3 + (long)local_50 * 4) < (int)local_3c;
          }
          iVar1 = local_4c;
          if (!bVar5) break;
          local_50 = local_50 + 1;
        }
        for (; local_50 < iVar1; iVar1 = iVar1 + -1) {
          *(undefined4 *)((long)pvVar3 + (long)iVar1 * 4) =
               *(undefined4 *)((long)pvVar3 + (long)(iVar1 + -1) * 4);
        }
        *(uint *)((long)pvVar3 + (long)local_50 * 4) = local_3c;
        local_4c = local_4c + 1;
      }
    }
    *(void **)(in_RDI + 0x10) = pvVar3;
    *(int *)(in_RDI + 0xc) = local_4c;
  }
  return 0;
}

Assistant:

static int unicodeAddExceptions(
  unicode_tokenizer *p,           /* Tokenizer to add exceptions to */
  int bAlnum,                     /* Replace Isalnum() return value with this */
  const char *zIn,                /* Array of characters to make exceptions */
  int nIn                         /* Length of z in bytes */
){
  const unsigned char *z = (const unsigned char *)zIn;
  const unsigned char *zTerm = &z[nIn];
  unsigned int iCode;
  int nEntry = 0;

  assert( bAlnum==0 || bAlnum==1 );

  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    assert( (sqlite3FtsUnicodeIsalnum((int)iCode) & 0xFFFFFFFE)==0 );
    if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum
     && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
    ){
      nEntry++;
    }
  }

  if( nEntry ){
    int *aNew;                    /* New aiException[] array */
    int nNew;                     /* Number of valid entries in array aNew[] */

    aNew = sqlite3_realloc64(p->aiException,(p->nException+nEntry)*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    nNew = p->nException;

    z = (const unsigned char *)zIn;
    while( z<zTerm ){
      READ_UTF8(z, zTerm, iCode);
      if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum
       && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
      ){
        int i, j;
        for(i=0; i<nNew && aNew[i]<(int)iCode; i++);
        for(j=nNew; j>i; j--) aNew[j] = aNew[j-1];
        aNew[i] = (int)iCode;
        nNew++;
      }
    }
    p->aiException = aNew;
    p->nException = nNew;
  }

  return SQLITE_OK;
}